

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
r_code::list<r_exec::CInput>::push_back_new_cell(list<r_exec::CInput> *this,CInput *t)

{
  cell c;
  
  c.next = -1;
  c.prev = -1;
  c.data.ijt = 0;
  c.data._0_9_ = SUB169((undefined1  [16])0x0,0);
  c.data.abstraction.object._1_7_ = 0;
  c.data._16_9_ = SUB169((undefined1  [16])0x0,7);
  r_exec::CInput::operator=(&c.data,t);
  c.next = -1;
  c.prev = this->used_cells_tail;
  std::
  vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>::
  push_back(&this->cells,&c);
  this->used_cells_tail =
       ((long)(this->cells).
              super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->cells).
             super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x38 + -1;
  r_exec::CInput::~CInput(&c.data);
  return;
}

Assistant:

cell(): next(null), prev(null) {}